

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O1

void __thiscall
QComboBoxPrivate::dataChanged(QComboBoxPrivate *this,QModelIndex *topLeft,QModelIndex *bottomRight)

{
  QWidget *this_00;
  QAbstractItemModel *pQVar1;
  char cVar2;
  int iVar3;
  long in_FS_OFFSET;
  QAccessibleValueChangeEvent event;
  QString local_b8;
  QVariant local_98;
  QModelIndex local_78;
  undefined1 *puStack_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->field_0x34c & 8) == 0) {
    this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    pQVar1 = (topLeft->m).ptr;
    if (pQVar1 == (QAbstractItemModel *)0x0) {
      local_78._0_8_ = (code *)0xffffffffffffffff;
      local_78.i = 0;
      local_78.m.ptr = (QAbstractItemModel *)0x0;
    }
    else {
      (**(code **)(*(long *)pQVar1 + 0x68))(&local_78,pQVar1,topLeft);
    }
    cVar2 = comparesEqual(&this->root,&local_78);
    if (cVar2 != '\0') {
      if (this->sizeAdjustPolicy == AdjustToContents) {
        (this->sizeHint).wd = -1;
        (this->sizeHint).ht = -1;
        adjustComboBoxSize(this);
        QWidget::updateGeometry(this_00);
      }
      iVar3 = QPersistentModelIndex::row();
      if (topLeft->r <= iVar3) {
        iVar3 = QPersistentModelIndex::row();
        if (iVar3 <= bottomRight->r) {
          local_b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_b8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          iVar3 = QPersistentModelIndex::row();
          QComboBox::itemText(&local_b8,(QComboBox *)this_00,iVar3);
          if (this->lineEdit == (QLineEdit *)0x0) {
            updateCurrentText(this,&local_b8);
          }
          else {
            QLineEdit::setText(this->lineEdit,&local_b8);
            updateLineEditGeometry(this);
          }
          QWidget::update(this_00);
          local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
          puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
          local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
          local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
          puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
          local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_78.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
          ::QVariant::QVariant(&local_98,(QString *)&local_b8);
          local_78.i._0_4_ = 0x80c1;
          puStack_60 = (undefined1 *)CONCAT44(puStack_60._4_4_,0xffffffff);
          local_78._0_8_ = QTextDocument::setMarkdown;
          local_78.m.ptr = (QAbstractItemModel *)this_00;
          ::QVariant::QVariant((QVariant *)&local_58,&local_98);
          local_78.i = CONCAT44(local_78.i._4_4_,0x800e);
          ::QVariant::~QVariant(&local_98);
          QAccessible::updateAccessibility((QAccessibleEvent *)&local_78);
          QAccessibleValueChangeEvent::~QAccessibleValueChangeEvent
                    ((QAccessibleValueChangeEvent *)&local_78);
          if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBoxPrivate::dataChanged(const QModelIndex &topLeft, const QModelIndex &bottomRight)
{
    Q_Q(QComboBox);
    if (inserting || topLeft.parent() != root)
        return;

    if (sizeAdjustPolicy == QComboBox::AdjustToContents) {
        sizeHint = QSize();
        adjustComboBoxSize();
        q->updateGeometry();
    }

    if (currentIndex.row() >= topLeft.row() && currentIndex.row() <= bottomRight.row()) {
        const QString text = q->itemText(currentIndex.row());
        if (lineEdit) {
            lineEdit->setText(text);
            updateLineEditGeometry();
        } else {
            updateCurrentText(text);
        }
        q->update();
#if QT_CONFIG(accessibility)
        QAccessibleValueChangeEvent event(q, text);
        QAccessible::updateAccessibility(&event);
#endif
    }
}